

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::IndexFinder::find
          (SelectionSet *__return_storage_ptr__,IndexFinder *this,int begMolIndex,int endMolIndex)

{
  long lVar1;
  long lVar2;
  _Vector_base<int,_std::allocator<int>_> _Stack_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&_Stack_48,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&_Stack_48)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_48);
  lVar2 = (long)begMolIndex;
  lVar1 = lVar2 * 0x18;
  for (; lVar2 < endMolIndex; lVar2 = lVar2 + 1) {
    SelectionSet::orOperator
              (__return_storage_ptr__,
               (SelectionSet *)
               ((long)&(((this->selectionSets_).
                         super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet IndexFinder::find(int begMolIndex, int endMolIndex) {
    SelectionSet ss(nObjects_);

#ifdef IS_MPI
    int proc;
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (int i = begMolIndex; i < endMolIndex; ++i) {
#ifdef IS_MPI
      proc = info_->getMolToProc(i);

      if (proc == worldRank) {
#endif
        ss |= selectionSets_[i];
#ifdef IS_MPI
      }
#endif
    }
    return ss;
  }